

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

int __thiscall pbrt::DisneyMaterial::writeTo(DisneyMaterial *this,BinaryWriter *binary)

{
  size_t in_RCX;
  void *in_RDX;
  
  BinaryWriter::write(binary,(int)this + 0x18,in_RDX,in_RCX);
  BinaryWriter::write<float>(binary,&this->anisotropic);
  BinaryWriter::write<float>(binary,&this->clearCoat);
  BinaryWriter::write<float>(binary,&this->clearCoatGloss);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->color);
  BinaryWriter::write<float>(binary,&this->diffTrans);
  BinaryWriter::write<float>(binary,&this->eta);
  BinaryWriter::write<float>(binary,&this->flatness);
  BinaryWriter::write<float>(binary,&this->metallic);
  BinaryWriter::write<float>(binary,&this->roughness);
  BinaryWriter::write<float>(binary,&this->sheen);
  BinaryWriter::write<float>(binary,&this->sheenTint);
  BinaryWriter::write<float>(binary,&this->specTrans);
  BinaryWriter::write<float>(binary,&this->specularTint);
  BinaryWriter::write<bool>(binary,&this->thin);
  return 0xb;
}

Assistant:

int DisneyMaterial::writeTo(BinaryWriter &binary) 
  {
    Material::writeTo(binary);
    binary.write(anisotropic);
    binary.write(clearCoat);
    binary.write(clearCoatGloss);
    binary.write(color);
    binary.write(diffTrans);
    binary.write(eta);
    binary.write(flatness);
    binary.write(metallic);
    binary.write(roughness);
    binary.write(sheen);
    binary.write(sheenTint);
    binary.write(specTrans);
    binary.write(specularTint);
    binary.write(thin);
    return TYPE_DISNEY_MATERIAL;
  }